

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmeticencoder.cpp
# Opt level: O2

void __thiscall ArithmeticEncoder::writeBits(ArithmeticEncoder *this,U32 bits,U32 sym)

{
  U32 *pUVar1;
  uint uVar2;
  uint uVar3;
  
  if ((0x1f < bits - 1) || (sym >> ((byte)bits & 0x1f) != 0)) {
    __assert_fail("bits && (bits <= 32) && (sym < (1u<<bits))",
                  "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/arithmeticencoder.cpp"
                  ,0x103,"void ArithmeticEncoder::writeBits(U32, U32)");
  }
  if (0x13 < bits) {
    writeShort(this,(U16)sym);
    sym = sym >> 0x10;
    bits = bits - 0x10;
  }
  uVar3 = this->length >> ((byte)bits & 0x1f);
  this->length = uVar3;
  pUVar1 = &this->base;
  uVar2 = *pUVar1;
  *pUVar1 = *pUVar1 + sym * uVar3;
  if (CARRY4(uVar2,sym * uVar3)) {
    propagate_carry(this);
    uVar3 = this->length;
  }
  if (uVar3 < 0x1000000) {
    renorm_enc_interval(this);
    return;
  }
  return;
}

Assistant:

void ArithmeticEncoder::writeBits(U32 bits, U32 sym)
{
  assert(bits && (bits <= 32) && (sym < (1u<<bits)));

  if (bits > 19)
  {
    writeShort(sym&U16_MAX);
    sym = sym >> 16;
    bits = bits - 16;
  }

  U32 init_base = base;
  base += sym * (length >>= bits);             // new interval base and length

  if (init_base > base) propagate_carry();                 // overflow = carry
  if (length < AC__MinLength) renorm_enc_interval();        // renormalization
}